

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O0

void __thiscall sjtu::TrainManager::add_train(TrainManager *this,int argc,string *argv)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  void *pvVar4;
  char *pcVar5;
  string *psVar6;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  pair<long,_bool> pVar7;
  undefined1 auVar8 [16];
  int len_3;
  int r_3;
  int l_3;
  int i_5;
  int len_2;
  int r_2;
  int l_2;
  int i_4;
  int len_1;
  int r_1;
  int l_1;
  int i_3;
  int len;
  int r;
  int l;
  int i_2;
  int j;
  int i_1;
  trainType *train;
  pair<sjtu::trainType_*,_long> ret;
  int i;
  string type;
  string saleDate;
  string stopoverTimes;
  string travelTimes;
  string startTime;
  string prices;
  string stations;
  string seatNum;
  string stationNum;
  string trainID;
  size_t *in_stack_fffffffffffffb88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb90;
  invalid_command *in_stack_fffffffffffffba0;
  string *in_stack_fffffffffffffba8;
  timeType *in_stack_fffffffffffffbb0;
  string *in_stack_fffffffffffffbb8;
  StringHasher *in_stack_fffffffffffffbc0;
  allocator *this_00;
  unsigned_long_long *in_stack_fffffffffffffc08;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>
  *in_stack_fffffffffffffc10;
  allocator local_371;
  string local_370 [32];
  hashType local_350;
  pair<unsigned_long_long,_long> local_348;
  pair<const_unsigned_long_long,_long> local_338;
  string local_328 [32];
  undefined8 local_308;
  undefined8 uStack_300;
  string local_2f8 [32];
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  string local_2c8 [32];
  int local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  string local_298 [32];
  int local_278;
  int local_274;
  int local_270;
  int local_26c;
  string local_268 [32];
  undefined8 local_248;
  undefined8 local_240;
  string local_238 [32];
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  string local_208 [32];
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  string *local_1d0;
  string *local_1c8;
  undefined8 local_1c0;
  long local_1b8;
  undefined1 local_1b0;
  string local_1a8 [32];
  hashType local_188;
  long local_180;
  undefined1 local_178;
  int local_15c;
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  long local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::string(local_58);
  std::__cxx11::string::string(local_78);
  std::__cxx11::string::string(local_98);
  std::__cxx11::string::string(local_b8);
  std::__cxx11::string::string(local_d8);
  std::__cxx11::string::string(local_f8);
  std::__cxx11::string::string(local_118);
  std::__cxx11::string::string(local_138);
  std::__cxx11::string::string(local_158);
  local_15c = 0;
  do {
    if (local_c <= local_15c) {
      std::__cxx11::string::string(local_1a8,local_38);
      local_188 = StringHasher::operator()(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      pVar7 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                        (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      local_1b8 = pVar7.first;
      local_1b0 = pVar7.second;
      local_180 = local_1b8;
      local_178 = local_1b0;
      std::__cxx11::string::~string(local_1a8);
      if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        auVar8 = (**(code **)(**(long **)(in_RDI + 0x20) + 8))();
        local_1c0 = auVar8._8_8_;
        psVar6 = auVar8._0_8_;
        *(undefined8 *)(psVar6 + 0xa7a0) = local_1c0;
        psVar6[0xa799] = (string)0x0;
        local_1d0 = psVar6;
        local_1c8 = psVar6;
        pcVar5 = (char *)std::__cxx11::string::c_str();
        strcpy((char *)psVar6,pcVar5);
        iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,0);
        *(int *)(local_1d0 + 0x18) = iVar2;
        iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,0);
        *(int *)(local_1d0 + 0x1c) = iVar2;
        for (local_1d4 = 0; local_1d4 < *(int *)(local_1d0 + 0x18); local_1d4 = local_1d4 + 1) {
          for (local_1d8 = 0; local_1d8 < 0x5c; local_1d8 = local_1d8 + 1) {
            *(undefined4 *)(local_1d0 + (long)local_1d8 * 4 + (long)local_1d4 * 0x1a8 + 0x4c) =
                 *(undefined4 *)(local_1d0 + 0x1c);
          }
        }
        local_1dc = 0;
        local_1e0 = 0;
        local_1e8 = std::__cxx11::string::size();
        for (; local_1dc < *(int *)(local_1d0 + 0x18); local_1dc = local_1dc + 1) {
          local_1e4 = local_1e0;
          while( true ) {
            bVar1 = false;
            if (local_1e4 < local_1e8) {
              pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_98);
              bVar1 = *pcVar5 != '|';
            }
            if (!bVar1) break;
            local_1e4 = local_1e4 + 1;
          }
          psVar6 = local_1d0 + (long)local_1dc * 0x1a8 + 0x20;
          std::__cxx11::string::substr((ulong)local_208,(ulong)local_98);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          strcpy((char *)psVar6,pcVar5);
          std::__cxx11::string::~string(local_208);
          local_1e0 = local_1e4 + 1;
        }
        local_20c = 1;
        local_210 = 0;
        local_218 = std::__cxx11::string::size();
        for (; local_20c < *(int *)(local_1d0 + 0x18); local_20c = local_20c + 1) {
          local_214 = local_210;
          while( true ) {
            bVar1 = false;
            if (local_214 < local_218) {
              pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_b8);
              bVar1 = *pcVar5 != '|';
            }
            if (!bVar1) break;
            local_214 = local_214 + 1;
          }
          std::__cxx11::string::substr((ulong)local_238,(ulong)local_b8);
          iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,0);
          *(int *)(local_1d0 + (long)local_20c * 0x1a8 + 0x1bc) = iVar2;
          std::__cxx11::string::~string(local_238);
          local_210 = local_214 + 1;
        }
        std::__cxx11::string::string(local_268,local_d8);
        timeType::timeType(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
        *(undefined8 *)(local_1d0 + 0xa788) = local_248;
        *(undefined8 *)(local_1d0 + 0xa790) = local_240;
        std::__cxx11::string::~string(local_268);
        local_26c = 1;
        local_270 = 0;
        local_278 = std::__cxx11::string::size();
        for (; local_26c < *(int *)(local_1d0 + 0x18); local_26c = local_26c + 1) {
          local_274 = local_270;
          while( true ) {
            bVar1 = false;
            if (local_274 < local_278) {
              pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_f8);
              bVar1 = *pcVar5 != '|';
            }
            if (!bVar1) break;
            local_274 = local_274 + 1;
          }
          std::__cxx11::string::substr((ulong)local_298,(ulong)local_f8);
          iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,0);
          *(int *)(local_1d0 + (long)local_26c * 0x1a8 + 0x1c4) = iVar2;
          std::__cxx11::string::~string(local_298);
          local_270 = local_274 + 1;
        }
        local_29c = 1;
        local_2a0 = 0;
        local_2a8 = std::__cxx11::string::size();
        for (; local_29c < *(int *)(local_1d0 + 0x18) + -1; local_29c = local_29c + 1) {
          local_2a4 = local_2a0;
          while( true ) {
            bVar1 = false;
            if (local_2a4 < local_2a8) {
              pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_118);
              bVar1 = *pcVar5 != '|';
            }
            if (!bVar1) break;
            local_2a4 = local_2a4 + 1;
          }
          std::__cxx11::string::substr((ulong)local_2c8,(ulong)local_118);
          iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,0);
          *(int *)(local_1d0 + (long)local_29c * 0x1a8 + 0x1c0) = iVar2;
          std::__cxx11::string::~string(local_2c8);
          local_2a0 = local_2a4 + 1;
        }
        std::__cxx11::string::substr((ulong)local_2f8,(ulong)local_138);
        timeType::timeType(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
        *(undefined8 *)(local_1d0 + 0xa768) = local_2d8;
        *(undefined8 *)(local_1d0 + 0xa770) = uStack_2d0;
        std::__cxx11::string::substr((ulong)local_328,(ulong)local_138);
        timeType::timeType(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
        *(undefined8 *)(local_1d0 + 0xa778) = local_308;
        *(undefined8 *)(local_1d0 + 0xa780) = uStack_300;
        std::__cxx11::string::~string(local_328);
        std::__cxx11::string::~string(local_2f8);
        psVar6 = (string *)std::__cxx11::string::operator[]((ulong)local_158);
        local_1d0[0xa798] = *psVar6;
        (**(code **)(**(long **)(in_RDI + 0x20) + 0x18))
                  (*(long **)(in_RDI + 0x20),local_1d0 + 0xa7a0);
        this_00 = &local_371;
        psVar6 = local_1d0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_370,(char *)psVar6,this_00);
        local_350 = StringHasher::operator()((StringHasher *)this_00,psVar6);
        local_348 = std::make_pair<unsigned_long_long,long&>
                              ((unsigned_long_long *)in_stack_fffffffffffffb90,
                               (long *)in_stack_fffffffffffffb88);
        std::pair<const_unsigned_long_long,_long>::pair<unsigned_long_long,_long,_true>
                  (&local_338,&local_348);
        BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::insert(_l,_len);
        std::__cxx11::string::~string(local_370);
        std::allocator<char>::~allocator((allocator<char> *)&local_371);
        pvVar4 = (void *)std::ostream::operator<<(&std::cout,0);
        std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      }
      else {
        pvVar4 = (void *)std::ostream::operator<<(&std::cout,-1);
        std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      }
      std::__cxx11::string::~string(local_158);
      std::__cxx11::string::~string(local_138);
      std::__cxx11::string::~string(local_118);
      std::__cxx11::string::~string(local_f8);
      std::__cxx11::string::~string(local_d8);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_78);
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::~string(local_38);
      return;
    }
    bVar1 = std::operator==(in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88);
    if (bVar1) {
      std::__cxx11::string::operator=(local_38,(string *)((long)local_15c * 0x20 + 0x20 + local_18))
      ;
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88);
      if (bVar1) {
        std::__cxx11::string::operator=
                  (local_58,(string *)((long)local_15c * 0x20 + 0x20 + local_18));
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88);
        if (bVar1) {
          std::__cxx11::string::operator=
                    (local_78,(string *)((long)local_15c * 0x20 + 0x20 + local_18));
        }
        else {
          bVar1 = std::operator==(in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88);
          if (bVar1) {
            std::__cxx11::string::operator=
                      (local_98,(string *)((long)local_15c * 0x20 + 0x20 + local_18));
          }
          else {
            bVar1 = std::operator==(in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88);
            if (bVar1) {
              std::__cxx11::string::operator=
                        (local_b8,(string *)((long)local_15c * 0x20 + 0x20 + local_18));
            }
            else {
              bVar1 = std::operator==(in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88);
              if (bVar1) {
                std::__cxx11::string::operator=
                          (local_d8,(string *)((long)local_15c * 0x20 + 0x20 + local_18));
              }
              else {
                bVar1 = std::operator==(in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88)
                ;
                if (bVar1) {
                  std::__cxx11::string::operator=
                            (local_f8,(string *)((long)local_15c * 0x20 + 0x20 + local_18));
                }
                else {
                  bVar1 = std::operator==(in_stack_fffffffffffffb90,
                                          (char *)in_stack_fffffffffffffb88);
                  if (bVar1) {
                    std::__cxx11::string::operator=
                              (local_118,(string *)((long)local_15c * 0x20 + 0x20 + local_18));
                  }
                  else {
                    bVar1 = std::operator==(in_stack_fffffffffffffb90,
                                            (char *)in_stack_fffffffffffffb88);
                    if (bVar1) {
                      std::__cxx11::string::operator=
                                (local_138,(string *)((long)local_15c * 0x20 + 0x20 + local_18));
                    }
                    else {
                      bVar1 = std::operator==(in_stack_fffffffffffffb90,
                                              (char *)in_stack_fffffffffffffb88);
                      if (!bVar1) {
                        uVar3 = __cxa_allocate_exception(0x68);
                        invalid_command::invalid_command(in_stack_fffffffffffffba0);
                        __cxa_throw(uVar3,&invalid_command::typeinfo,
                                    invalid_command::~invalid_command);
                      }
                      std::__cxx11::string::operator=
                                (local_158,(string *)((long)local_15c * 0x20 + 0x20 + local_18));
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_15c = local_15c + 2;
  } while( true );
}

Assistant:

void add_train(int argc , std::string *argv)
		{
			std::string trainID , stationNum , seatNum , stations , prices , startTime , travelTimes , stopoverTimes , saleDate , type;
			for (int i = 0;i < argc;i += 2)
				if (argv[i] == "-i") trainID = argv[i + 1];
				else if (argv[i] == "-n") stationNum = argv[i + 1];
				else if (argv[i] == "-m") seatNum = argv[i + 1];
				else if (argv[i] == "-s") stations = argv[i + 1];
				else if (argv[i] == "-p") prices = argv[i + 1];
				else if (argv[i] == "-x") startTime = argv[i + 1];
				else if (argv[i] == "-t") travelTimes = argv[i + 1];
				else if (argv[i] == "-o") stopoverTimes = argv[i + 1];
				else if (argv[i] == "-d") saleDate = argv[i + 1];
				else if (argv[i] == "-y") type = argv[i + 1];
				else throw invalid_command();
			if (TrainBpTree -> find(hasher(trainID)).second) std::cout << -1 << std::endl;
			else
			{
				auto ret = TrainFile -> newspace();
				trainType *train = ret.first;
				train -> offset = ret.second , train -> is_released = false;
				strcpy(train -> trainID , trainID.c_str());
				train -> stationNum = stoi(stationNum) , train -> seatNum = stoi(seatNum);
				for (int i = 0;i < train -> stationNum;++ i)
					for (int j = 0;j < 92;++ j)
						train -> stations[i].seatNum[j] = train -> seatNum;
				for (int i = 0 , l = 0 , r , len = stations.size();i < train -> stationNum;++ i , l = r + 1)
				{
					for (r = l;r < len && stations[r] != '|';++ r);
					strcpy(train -> stations[i].stationName , stations.substr(l , r - l).c_str());
				}
				for (int i = 1 , l = 0 , r , len = prices.size();i < train -> stationNum;++ i , l = r + 1)
				{
					for (r = l;r < len && prices[r] != '|';++ r);
					train -> stations[i].price = stoi(prices.substr(l , r - l));
				}
				train -> startTime = timeType(startTime);
				for (int i = 1 , l = 0 , r , len = travelTimes.size();i < train -> stationNum;++ i , l = r + 1)
				{
					for (r = l;r < len && travelTimes[r] != '|';++ r);
					train -> stations[i].travelTime = stoi(travelTimes.substr(l , r - l));
				}
				for (int i = 1 , l = 0 , r , len = stopoverTimes.size();i < train -> stationNum - 1;++ i , l = r + 1)
				{
					for (r = l;r < len && stopoverTimes[r] != '|';++ r);
					train -> stations[i].stopoverTime = stoi(stopoverTimes.substr(l , r - l));
				}
				train -> saleDate[0] = timeType(saleDate.substr(0 , 5)) , train -> saleDate[1] = timeType(saleDate.substr(6 , 5));
				train -> type = type[0];
				TrainFile -> save(train -> offset) , TrainBpTree -> insert(std::make_pair(hasher(train -> trainID) , train -> offset));
				std::cout << 0 << std::endl;
			}
		}